

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<kratos::Generator,_std::shared_ptr<kratos::Generator>,_kratos::IRNode> * __thiscall
pybind11::class_<kratos::Generator,std::shared_ptr<kratos::Generator>,kratos::IRNode>::
def_property_readonly<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&(kratos::Generator::*)()const>
          (class_<kratos::Generator,std::shared_ptr<kratos::Generator>,kratos::IRNode> *this,
          char *name,offset_in_Var_to_subr *fget)

{
  class_<kratos::Generator,_std::shared_ptr<kratos::Generator>,_kratos::IRNode> *pcVar1;
  cpp_function local_30;
  return_value_policy local_21;
  
  cpp_function::
  cpp_function<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,kratos::Generator>
            (&local_30,*fget);
  local_21 = reference_internal;
  pcVar1 = class_<kratos::Generator,_std::shared_ptr<kratos::Generator>,_kratos::IRNode>::
           def_property_readonly<pybind11::return_value_policy>
                     ((class_<kratos::Generator,_std::shared_ptr<kratos::Generator>,_kratos::IRNode>
                       *)this,name,&local_30,&local_21);
  object::~object((object *)&local_30);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }